

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O2

bool __thiscall
spvtools::val::BasicBlock::structurally_postdominates(BasicBlock *this,BasicBlock *other)

{
  bool bVar1;
  BasicBlock *local_d0;
  DominatorIterator local_c8;
  DominatorIterator local_a0;
  DominatorIterator local_78;
  DominatorIterator local_50;
  
  if (this == other) {
    bVar1 = true;
  }
  else {
    DominatorIterator::DominatorIterator(&local_78);
    structural_pdom_begin(&local_a0,other);
    DominatorIterator::DominatorIterator(&local_c8);
    local_d0 = this;
    std::find<spvtools::val::BasicBlock::DominatorIterator,spvtools::val::BasicBlock_const*>
              (&local_50,&local_a0,&local_c8,&local_d0);
    bVar1 = local_78.current_ != local_50.current_;
    if (local_50.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_50.dom_func_,(_Any_data *)&local_50.dom_func_,__destroy_functor
                );
    }
    if (local_c8.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_c8.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_c8.dom_func_,(_Any_data *)&local_c8.dom_func_,__destroy_functor
                );
    }
    if (local_a0.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_a0.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_a0.dom_func_,(_Any_data *)&local_a0.dom_func_,__destroy_functor
                );
    }
    if (local_78.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_78.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_78.dom_func_,(_Any_data *)&local_78.dom_func_,__destroy_functor
                );
    }
  }
  return bVar1;
}

Assistant:

bool BasicBlock::structurally_postdominates(const BasicBlock& other) const {
  return (this == &other) || !(other.structural_pdom_end() ==
                               std::find(other.structural_pdom_begin(),
                                         other.structural_pdom_end(), this));
}